

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O0

void __thiscall
CVIterator_Predecrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>::
TestBody(CVIterator_Predecrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>
         *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  AssertionResult gtest_ar_5;
  Message local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  TypeParam it;
  Message local_38;
  uint local_2c;
  size_type local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CVIterator_Predecrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>
  *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::size
                       (&(this->
                         super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>
                         ).cv_);
  local_2c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_20,"this->cv_.size ()","4U",&local_28,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it.index_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it.index_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it.index_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::end
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)&gtest_ar_1.message_);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator--
            ((iterator_base<false> *)&gtest_ar_1.message_);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator*
                     ((iterator_base<false> *)&gtest_ar_1.message_);
  local_74 = 7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_70,"*it","7",pvVar3,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator--
            ((iterator_base<false> *)&gtest_ar_1.message_);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator*
                     ((iterator_base<false> *)&gtest_ar_1.message_);
  local_9c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_98,"*it","5",pvVar3,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator--
            ((iterator_base<false> *)&gtest_ar_1.message_);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator*
                     ((iterator_base<false> *)&gtest_ar_1.message_);
  local_c4 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c0,"*it","3",pvVar3,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator--
            ((iterator_base<false> *)&gtest_ar_1.message_);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>::operator*
                     ((iterator_base<false> *)&gtest_ar_1.message_);
  local_ec = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e8,"*it","2",pvVar3,&local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_120);
  testing::internal::EqHelper::
  Compare<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>,_pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>,_nullptr>
            ((EqHelper *)local_110,"it","this->cv_.begin ()",
             (iterator_base<false> *)&gtest_ar_1.message_,(iterator_base<false> *)local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TYPED_TEST (CVIterator, Predecrement) {
    EXPECT_EQ (this->cv_.size (), 4U);

    TypeParam it = this->cv_.end ();
    --it;
    EXPECT_EQ (*it, 7);
    --it;
    EXPECT_EQ (*it, 5);
    --it;
    EXPECT_EQ (*it, 3);
    --it;
    EXPECT_EQ (*it, 2);
    EXPECT_EQ (it, this->cv_.begin ());
}